

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O1

int __thiscall Centaurus::ATNPath::count(ATNPath *this,Identifier *id,int index)

{
  pointer ppVar1;
  pointer pwVar2;
  size_t __n;
  wchar_t *__s2;
  int iVar3;
  pointer ppVar4;
  int iVar5;
  bool bVar6;
  wchar_t *local_58;
  size_t local_50;
  wchar_t local_48 [4];
  int local_38;
  
  ppVar4 = (this->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = local_48;
  pwVar2 = (id->m_id)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_58,pwVar2,pwVar2 + (id->m_id)._M_string_length);
  __s2 = local_58;
  local_38 = index;
  if (ppVar4 == ppVar1) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      __n = (ppVar4->first).m_id._M_string_length;
      if (__n == local_50) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = wmemcmp((ppVar4->first).m_id._M_dataplus._M_p,__s2,__n);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      iVar5 = iVar5 + (uint)(byte)(ppVar4->second == index & bVar6);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return iVar5;
}

Assistant:

int count(const Identifier& id, int index) const
    {
        return std::count(cbegin(), cend(), std::pair<Identifier, int>(id, index));
    }